

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::analysis::DefUseManager::GetAnnotations
          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,DefUseManager *this,uint32_t id)

{
  Instruction *def;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  def = GetDef(this,id);
  if (def != (Instruction *)0x0) {
    local_38._8_8_ = 0;
    pcStack_20 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp:213:20)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp:213:20)>
               ::_M_manager;
    local_38._M_unused._M_object = __return_storage_ptr__;
    ForEachUser(this,def,(function<void_(spvtools::opt::Instruction_*)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Instruction*> DefUseManager::GetAnnotations(uint32_t id) const {
  std::vector<Instruction*> annos;
  const Instruction* def = GetDef(id);
  if (!def) return annos;

  ForEachUser(def, [&annos](Instruction* user) {
    if (IsAnnotationInst(user->opcode())) {
      annos.push_back(user);
    }
  });
  return annos;
}